

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::InputScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_step,
                       void *p_step_fast,char *format,ImGuiInputTextFlags flags)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  char *text;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  char *text_end;
  uint flags_00;
  void *pvVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  char buf [64];
  ImVec2 local_90;
  char *local_88;
  void *local_80;
  char local_78 [72];
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    if (format == (char *)0x0) {
      format = GDataTypeInfo[data_type].PrintFmt;
    }
    local_80 = p_step_fast;
    DataTypeFormatString(local_78,0x40,data_type,p_data,format);
    flags_00 = (uint)((flags & 0x20002U) == 0) | flags | 0x8000010;
    if (p_step == (void *)0x0) {
      local_90.x = 0.0;
      local_90.y = 0.0;
      bVar6 = false;
      bVar5 = InputTextEx(label,(char *)0x0,local_78,0x40,&local_90,flags_00,
                          (ImGuiInputTextCallback)0x0,(void *)0x0);
      if (bVar5) {
        bVar6 = DataTypeApplyFromText(local_78,data_type,p_data,format);
      }
    }
    else {
      fVar8 = GetFrameHeight();
      BeginGroup();
      local_88 = label;
      PushID(label);
      fVar9 = CalcItemWidth();
      fVar10 = (pIVar3->Style).ItemInnerSpacing.x + fVar8;
      fVar9 = fVar9 - (fVar10 + fVar10);
      fVar10 = 1.0;
      if (1.0 <= fVar9) {
        fVar10 = fVar9;
      }
      SetNextItemWidth(fVar10);
      local_90.x = 0.0;
      local_90.y = 0.0;
      bVar6 = false;
      bVar5 = InputTextEx("",(char *)0x0,local_78,0x40,&local_90,flags_00,
                          (ImGuiInputTextCallback)0x0,(void *)0x0);
      if (bVar5) {
        bVar6 = DataTypeApplyFromText(local_78,data_type,p_data,format);
      }
      pvVar4 = local_80;
      IVar2 = (pIVar3->Style).FramePadding;
      (pIVar3->Style).FramePadding.x = (pIVar3->Style).FramePadding.y;
      if (((uint)flags >> 0xe & 1) != 0) {
        BeginDisabled(true);
      }
      SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
      local_90.y = fVar8;
      local_90.x = fVar8;
      bVar5 = ButtonEx("-",&local_90,0x2400);
      if (bVar5) {
        pvVar7 = p_step;
        if ((pIVar3->IO).KeyCtrl != false) {
          pvVar7 = pvVar4;
        }
        if (pvVar4 == (void *)0x0) {
          pvVar7 = p_step;
        }
        DataTypeApplyOp(data_type,0x2d,p_data,p_data,pvVar7);
        bVar6 = true;
      }
      SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
      bVar5 = ButtonEx("+",&local_90,0x2400);
      if (bVar5) {
        pvVar7 = p_step;
        if ((pIVar3->IO).KeyCtrl != false) {
          pvVar7 = pvVar4;
        }
        if (pvVar4 == (void *)0x0) {
          pvVar7 = p_step;
        }
        DataTypeApplyOp(data_type,0x2b,p_data,p_data,pvVar7);
        bVar6 = true;
      }
      if (((uint)flags >> 0xe & 1) != 0) {
        EndDisabled();
      }
      text = local_88;
      text_end = FindRenderedTextEnd(local_88,(char *)0x0);
      if (text_end != text) {
        SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
        TextEx(text,text_end,0);
      }
      (pIVar3->Style).FramePadding = IVar2;
      PopID();
      EndGroup();
    }
    if (bVar6 != false) {
      MarkItemEdited((pIVar3->LastItemData).ID);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}